

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813::LoadableStateIncrement
          (ChElementHexaANCF_3813 *this,uint off_x,ChState *x_new,ChState *x,uint off_v,
          ChStateDelta *Dv)

{
  long *plVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 0x10) {
    plVar1 = *(long **)((long)&(((this->m_nodes).
                                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar2);
    (**(code **)(*plVar1 + 0xa8))(plVar1,off_x + 3,x_new,x,off_v,Dv);
    off_v = off_v + 3;
  }
  return;
}

Assistant:

void ChElementHexaANCF_3813::LoadableStateIncrement(const unsigned int off_x,
                                                    ChState& x_new,
                                                    const ChState& x,
                                                    const unsigned int off_v,
                                                    const ChStateDelta& Dv) {
    for (int i = 0; i < 8; ++i) {
        this->m_nodes[i]->NodeIntStateIncrement(off_x + 3 * 1, x_new, x, off_v + 3 * i, Dv);
    }
}